

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::Base64UnescapeInternal
              (char *src_param,int szsrc,char *dest,int szdest,char *unbase64)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int in_ECX;
  byte *pbVar6;
  long in_RDX;
  int in_ESI;
  byte *in_RDI;
  long in_R8;
  int equals;
  int expected_equals;
  uchar *src;
  uint temp;
  uint ch;
  int state;
  int destidx;
  int decode;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  LogLevel level;
  int local_a4;
  LogMessage local_90;
  int local_54;
  byte *local_50;
  uint value;
  uint uVar7;
  int iVar8;
  int local_38;
  uint local_34;
  int local_14;
  
  local_34 = 0;
  local_38 = 0;
  iVar8 = 0;
  uVar7 = 0;
  value = 0;
  local_50 = in_RDI;
  local_14 = in_ESI;
  if (in_RDX == 0) {
    while (3 < local_14) {
      if ((((*local_50 == 0) || (local_50[1] == 0)) || (local_50[2] == 0)) ||
         (value = (int)*(char *)(in_R8 + (ulong)*local_50) << 0x12 |
                  (int)*(char *)(in_R8 + (ulong)local_50[1]) << 0xc |
                  (int)*(char *)(in_R8 + (ulong)local_50[2]) << 6 |
                  (int)*(char *)(in_R8 + (ulong)local_50[3]), (value & 0x80000000) != 0)) {
        while( true ) {
          local_14 = local_14 + -1;
          pbVar6 = local_50 + 1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          cVar2 = *(char *)(in_R8 + (ulong)uVar7);
          local_50 = pbVar6;
          if (-1 < cVar2) break;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 4)) {
            iVar8 = 0;
            local_34 = (int)cVar2;
            goto LAB_00443788;
          }
        }
        while( true ) {
          local_14 = local_14 + -1;
          pbVar6 = local_50 + 1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          cVar2 = *(char *)(in_R8 + (ulong)uVar7);
          local_50 = pbVar6;
          if (-1 < cVar2) break;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 3)) {
            iVar8 = 1;
            local_34 = (int)cVar2;
            goto LAB_00443788;
          }
        }
        while( true ) {
          local_14 = local_14 + -1;
          pbVar6 = local_50 + 1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          cVar2 = *(char *)(in_R8 + (ulong)uVar7);
          local_50 = pbVar6;
          if (-1 < cVar2) break;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 2)) {
            iVar8 = 2;
            local_34 = (int)cVar2;
            goto LAB_00443788;
          }
        }
        while( true ) {
          local_14 = local_14 + -1;
          pbVar6 = local_50 + 1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          local_34 = (uint)*(char *)(in_R8 + (ulong)uVar7);
          local_50 = pbVar6;
          if (-1 < (int)local_34) break;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 1)) {
            iVar8 = 3;
            goto LAB_00443788;
          }
        }
      }
      else {
        local_14 = local_14 + -4;
        local_34 = 0xffffffff;
        uVar7 = 0;
        local_50 = local_50 + 4;
      }
      local_38 = local_38 + 3;
    }
  }
  else {
    while (3 < local_14) {
      if ((((*local_50 == 0) || (local_50[1] == 0)) || (local_50[2] == 0)) ||
         (value = (int)*(char *)(in_R8 + (ulong)*local_50) << 0x12 |
                  (int)*(char *)(in_R8 + (ulong)local_50[1]) << 0xc |
                  (int)*(char *)(in_R8 + (ulong)local_50[2]) << 6 |
                  (int)*(char *)(in_R8 + (ulong)local_50[3]), (value & 0x80000000) != 0)) {
        while( true ) {
          local_14 = local_14 + -1;
          pbVar6 = local_50 + 1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          uVar4 = (uint)*(char *)(in_R8 + (ulong)uVar7);
          local_50 = pbVar6;
          if (-1 < (int)uVar4) break;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 4)) {
            iVar8 = 0;
            local_34 = uVar4;
            goto LAB_00443788;
          }
        }
        while( true ) {
          local_14 = local_14 + -1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          local_34 = (uint)*(char *)(in_R8 + (ulong)uVar7);
          if (-1 < (int)local_34) break;
          local_50 = local_50 + 1;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 3)) {
            iVar8 = 1;
            value = uVar4;
            goto LAB_00443788;
          }
        }
        value = uVar4 << 6 | local_34;
        local_50 = local_50 + 1;
        while( true ) {
          local_14 = local_14 + -1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          local_34 = (uint)*(char *)(in_R8 + (ulong)uVar7);
          if (-1 < (int)local_34) break;
          local_50 = local_50 + 1;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 2)) {
            iVar8 = 2;
            goto LAB_00443788;
          }
        }
        value = value << 6 | local_34;
        local_50 = local_50 + 1;
        while( true ) {
          local_14 = local_14 + -1;
          bVar1 = *local_50;
          uVar7 = (uint)bVar1;
          local_34 = (uint)*(char *)(in_R8 + (ulong)uVar7);
          if (-1 < (int)local_34) break;
          local_50 = local_50 + 1;
          bVar3 = ascii_isspace(bVar1);
          if ((!bVar3) || (local_14 < 1)) {
            iVar8 = 3;
            goto LAB_00443788;
          }
        }
        value = value << 6 | local_34;
        local_50 = local_50 + 1;
      }
      else {
        local_14 = local_14 + -4;
        local_50 = local_50 + 4;
        local_34 = 0xffffffff;
        uVar7 = 0;
      }
      if (in_ECX < local_38 + 3) {
        return -1;
      }
      *(char *)(in_RDX + (local_38 + 2)) = (char)value;
      *(char *)(in_RDX + (local_38 + 1)) = (char)(value >> 8);
      *(char *)(in_RDX + local_38) = (char)(value >> 0x10);
      local_38 = local_38 + 3;
      value = value >> 0x10;
    }
  }
LAB_00443788:
  if (((((int)local_34 < 0) && (uVar7 != 0)) && (uVar7 != 0x3d)) &&
     ((uVar7 != 0x2e && (bVar3 = ascii_isspace((char)uVar7), !bVar3)))) {
    return -1;
  }
  level = (LogLevel)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if ((uVar7 == 0x3d) || (iVar5 = local_14, uVar7 == 0x2e)) {
    local_50 = local_50 + -1;
    iVar5 = local_14 + 1;
  }
  else {
    do {
      while( true ) {
        local_14 = iVar5;
        level = (LogLevel)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        iVar5 = local_14;
        if (local_14 < 1) goto LAB_00443a02;
        iVar5 = local_14 + -1;
        pbVar6 = local_50 + 1;
        bVar1 = *local_50;
        uVar7 = (uint)bVar1;
        local_50 = pbVar6;
        if (*(char *)(in_R8 + (ulong)uVar7) < 0) break;
        value = value << 6 | (int)*(char *)(in_R8 + (ulong)uVar7);
        iVar8 = iVar8 + 1;
        if (iVar8 == 4) {
          if (in_RDX != 0) {
            if (in_ECX < local_38 + 3) {
              return -1;
            }
            *(char *)(in_RDX + (local_38 + 2)) = (char)value;
            *(char *)(in_RDX + (local_38 + 1)) = (char)(value >> 8);
            *(char *)(in_RDX + local_38) = (char)(value >> 0x10);
          }
          local_38 = local_38 + 3;
          iVar8 = 0;
          value = 0;
        }
      }
      bVar3 = ascii_isspace(bVar1);
      level = (LogLevel)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    } while (bVar3);
    if (uVar7 != 0) {
      if ((uVar7 != 0x3d) && (uVar7 != 0x2e)) {
        return -1;
      }
      local_50 = local_50 + -1;
      iVar5 = local_14;
    }
  }
LAB_00443a02:
  local_14 = iVar5;
  local_54 = 0;
  switch(iVar8) {
  case 0:
    break;
  case 1:
    return -1;
  case 2:
    if (in_RDX != 0) {
      if (in_ECX < local_38 + 1) {
        return -1;
      }
      *(char *)(in_RDX + local_38) = (char)(value >> 4);
    }
    local_38 = local_38 + 1;
    local_54 = 2;
    break;
  case 3:
    if (in_RDX != 0) {
      if (in_ECX < local_38 + 2) {
        return -1;
      }
      *(char *)(in_RDX + (local_38 + 1)) = (char)(value >> 2);
      *(char *)(in_RDX + local_38) = (char)((value >> 2) >> 8);
    }
    local_38 = local_38 + 2;
    local_54 = 1;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_90,level,(char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
               ,in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::operator<<((LogMessage *)CONCAT44(iVar8,uVar7),value);
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x443be3);
  }
  local_a4 = 0;
  while( true ) {
    bVar3 = false;
    if (0 < local_14) {
      bVar3 = *local_50 != 0;
    }
    if (!bVar3) break;
    if ((*local_50 == 0x3d) || (*local_50 == 0x2e)) {
      local_a4 = local_a4 + 1;
    }
    else {
      bVar3 = ascii_isspace(*local_50);
      if (!bVar3) {
        return -1;
      }
    }
    local_14 = local_14 + -1;
    local_50 = local_50 + 1;
  }
  if (local_a4 == 0) {
    return local_38;
  }
  if (local_a4 == local_54) {
    return local_38;
  }
  return -1;
}

Assistant:

int Base64UnescapeInternal(const char *src_param, int szsrc,
                           char *dest, int szdest,
                           const signed char* unbase64) {
  static const char kPad64Equals = '=';
  static const char kPad64Dot = '.';

  int decode = 0;
  int destidx = 0;
  int state = 0;
  unsigned int ch = 0;
  unsigned int temp = 0;

  // If "char" is signed by default, using *src as an array index results in
  // accessing negative array elements. Treat the input as a pointer to
  // unsigned char to avoid this.
  const unsigned char *src = reinterpret_cast<const unsigned char*>(src_param);

  // The GET_INPUT macro gets the next input character, skipping
  // over any whitespace, and stopping when we reach the end of the
  // string or when we read any non-data character.  The arguments are
  // an arbitrary identifier (used as a label for goto) and the number
  // of data bytes that must remain in the input to avoid aborting the
  // loop.
#define GET_INPUT(label, remain)                 \
  label:                                         \
    --szsrc;                                     \
    ch = *src++;                                 \
    decode = unbase64[ch];                       \
    if (decode < 0) {                            \
      if (ascii_isspace(ch) && szsrc >= remain)  \
        goto label;                              \
      state = 4 - remain;                        \
      break;                                     \
    }

  // if dest is null, we're just checking to see if it's legal input
  // rather than producing output.  (I suspect this could just be done
  // with a regexp...).  We duplicate the loop so this test can be
  // outside it instead of in every iteration.

  if (dest) {
    // This loop consumes 4 input bytes and produces 3 output bytes
    // per iteration.  We can't know at the start that there is enough
    // data left in the string for a full iteration, so the loop may
    // break out in the middle; if so 'state' will be set to the
    // number of input bytes read.

    while (szsrc >= 4)  {
      // We'll start by optimistically assuming that the next four
      // bytes of the string (src[0..3]) are four good data bytes
      // (that is, no nulls, whitespace, padding chars, or illegal
      // chars).  We need to test src[0..2] for nulls individually
      // before constructing temp to preserve the property that we
      // never read past a null in the string (no matter how long
      // szsrc claims the string is).

      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        // Iff any of those four characters was bad (null, illegal,
        // whitespace, padding), then temp's high bit will be set
        // (because unbase64[] is -1 for all bad characters).
        //
        // We'll back up and resort to the slower decoder, which knows
        // how to handle those cases.

        GET_INPUT(first, 4);
        temp = decode;
        GET_INPUT(second, 3);
        temp = (temp << 6) | decode;
        GET_INPUT(third, 2);
        temp = (temp << 6) | decode;
        GET_INPUT(fourth, 1);
        temp = (temp << 6) | decode;
      } else {
        // We really did have four good data bytes, so advance four
        // characters in the string.

        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }

      // temp has 24 bits of input, so write that out as three bytes.

      if (destidx+3 > szdest) return -1;
      dest[destidx+2] = temp;
      temp >>= 8;
      dest[destidx+1] = temp;
      temp >>= 8;
      dest[destidx] = temp;
      destidx += 3;
    }
  } else {
    while (szsrc >= 4)  {
      if (!src[0] || !src[1] || !src[2] ||
          (temp = ((unsigned(unbase64[src[0]]) << 18) |
                   (unsigned(unbase64[src[1]]) << 12) |
                   (unsigned(unbase64[src[2]]) << 6) |
                   (unsigned(unbase64[src[3]])))) & 0x80000000) {
        GET_INPUT(first_no_dest, 4);
        GET_INPUT(second_no_dest, 3);
        GET_INPUT(third_no_dest, 2);
        GET_INPUT(fourth_no_dest, 1);
      } else {
        szsrc -= 4;
        src += 4;
        decode = -1;
        ch = '\0';
      }
      destidx += 3;
    }
  }

#undef GET_INPUT

  // if the loop terminated because we read a bad character, return
  // now.
  if (decode < 0 && ch != '\0' &&
      ch != kPad64Equals && ch != kPad64Dot && !ascii_isspace(ch))
    return -1;

  if (ch == kPad64Equals || ch == kPad64Dot) {
    // if we stopped by hitting an '=' or '.', un-read that character -- we'll
    // look at it again when we count to check for the proper number of
    // equals signs at the end.
    ++szsrc;
    --src;
  } else {
    // This loop consumes 1 input byte per iteration.  It's used to
    // clean up the 0-3 input bytes remaining when the first, faster
    // loop finishes.  'temp' contains the data from 'state' input
    // characters read by the first loop.
    while (szsrc > 0)  {
      --szsrc;
      ch = *src++;
      decode = unbase64[ch];
      if (decode < 0) {
        if (ascii_isspace(ch)) {
          continue;
        } else if (ch == '\0') {
          break;
        } else if (ch == kPad64Equals || ch == kPad64Dot) {
          // back up one character; we'll read it again when we check
          // for the correct number of pad characters at the end.
          ++szsrc;
          --src;
          break;
        } else {
          return -1;
        }
      }

      // Each input character gives us six bits of output.
      temp = (temp << 6) | decode;
      ++state;
      if (state == 4) {
        // If we've accumulated 24 bits of output, write that out as
        // three bytes.
        if (dest) {
          if (destidx+3 > szdest) return -1;
          dest[destidx+2] = temp;
          temp >>= 8;
          dest[destidx+1] = temp;
          temp >>= 8;
          dest[destidx] = temp;
        }
        destidx += 3;
        state = 0;
        temp = 0;
      }
    }
  }

  // Process the leftover data contained in 'temp' at the end of the input.
  int expected_equals = 0;
  switch (state) {
    case 0:
      // Nothing left over; output is a multiple of 3 bytes.
      break;

    case 1:
      // Bad input; we have 6 bits left over.
      return -1;

    case 2:
      // Produce one more output byte from the 12 input bits we have left.
      if (dest) {
        if (destidx+1 > szdest) return -1;
        temp >>= 4;
        dest[destidx] = temp;
      }
      ++destidx;
      expected_equals = 2;
      break;

    case 3:
      // Produce two more output bytes from the 18 input bits we have left.
      if (dest) {
        if (destidx+2 > szdest) return -1;
        temp >>= 2;
        dest[destidx+1] = temp;
        temp >>= 8;
        dest[destidx] = temp;
      }
      destidx += 2;
      expected_equals = 1;
      break;

    default:
      // state should have no other values at this point.
      GOOGLE_LOG(FATAL) << "This can't happen; base64 decoder state = " << state;
  }

  // The remainder of the string should be all whitespace, mixed with
  // exactly 0 equals signs, or exactly 'expected_equals' equals
  // signs.  (Always accepting 0 equals signs is a google extension
  // not covered in the RFC, as is accepting dot as the pad character.)

  int equals = 0;
  while (szsrc > 0 && *src) {
    if (*src == kPad64Equals || *src == kPad64Dot)
      ++equals;
    else if (!ascii_isspace(*src))
      return -1;
    --szsrc;
    ++src;
  }

  return (equals == 0 || equals == expected_equals) ? destidx : -1;
}